

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppAssert.cpp
# Opt level: O1

string * __thiscall
cppassert::DefaultFormatter::formatStatementFailureMessage_abi_cxx11_
          (string *__return_storage_ptr__,DefaultFormatter *this,char *statement)

{
  long lVar1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  this_00;
  AssertionMessage msg;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_20;
  char *local_18;
  
  local_18 = statement;
  internal::AssertionMessage::AssertionMessage((AssertionMessage *)&local_20);
  this_00._M_head_impl = local_20._M_head_impl;
  if (local_20._M_head_impl ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    this_00._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         operator_new(0x188);
    std::__cxx11::stringstream::stringstream((stringstream *)this_00._M_head_impl);
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      lVar1 = *(long *)local_20._M_head_impl;
      local_20._M_head_impl = this_00._M_head_impl;
      (**(code **)(lVar1 + 8))();
      this_00._M_head_impl = local_20._M_head_impl;
    }
  }
  local_20._M_head_impl = this_00._M_head_impl;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_20._M_head_impl + 0x10),"Assertion failure: ",0x13);
  internal::AssertionMessage::operator<<((AssertionMessage *)&local_20,&local_18);
  internal::AssertionMessage::str_abi_cxx11_(__return_storage_ptr__,(AssertionMessage *)&local_20);
  if (local_20._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_20._M_head_impl + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultFormatter::formatStatementFailureMessage(const char *statement)
{
    AssertionMessage msg;
    msg<< "Assertion failure: "<<statement;
    return msg.str();
}